

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::Tokenizer::TryParseFloat(string *text,double *result)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  bool local_29;
  char *local_28;
  char *end;
  char *start;
  double *result_local;
  string *text_local;
  
  start = (char *)result;
  result_local = (double *)text;
  end = (char *)std::__cxx11::string::c_str();
  dVar4 = NoLocaleStrtod(end,&local_28);
  *(double *)start = dVar4;
  if (((*local_28 == 'e') || (pcVar1 = local_28, *local_28 == 'E')) &&
     ((pcVar1 = local_28 + 1, *pcVar1 == '-' || (*pcVar1 == '+')))) {
    pcVar1 = local_28 + 2;
  }
  local_28 = pcVar1;
  if ((*local_28 == 'f') || (*local_28 == 'F')) {
    local_28 = local_28 + 1;
  }
  lVar2 = (long)local_28 - (long)end;
  lVar3 = std::__cxx11::string::size();
  local_29 = false;
  if (lVar2 == lVar3) {
    local_29 = *end != '-';
  }
  return local_29;
}

Assistant:

bool Tokenizer::TryParseFloat(const std::string& text, double* result) {
  const char* start = text.c_str();
  char* end;
  *result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  return static_cast<size_t>(end - start) == text.size() && *start != '-';
}